

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm1136_r2_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),3);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x14);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x16);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x17);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x4107b362;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x410120b4;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x11111111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x1dd20d2;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0x50078;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 1;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 2;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 3;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x1130003;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0x10030302;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1222110;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x140011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x12002111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x11231111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x1102131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x141;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x662) = 7;
  return;
}

Assistant:

static void arm1136_r2_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    /* What qemu calls "arm1136_r2" is actually the 1136 r0p2, ie an
     * older core than plain "arm1136". In particular this does not
     * have the v6K features.
     * These ID register values are correct for 1136 but may be wrong
     * for 1136_r2 (in particular r0p2 does not actually implement most
     * of the ID registers).
     */

    set_feature(&cpu->env, ARM_FEATURE_V6);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    set_feature(&cpu->env, ARM_FEATURE_CACHE_DIRTY_REG);
    set_feature(&cpu->env, ARM_FEATURE_CACHE_BLOCK_OPS);
    cpu->midr = 0x4107b362;
    cpu->reset_fpsid = 0x410120b4;
    cpu->isar.mvfr0 = 0x11111111;
    cpu->isar.mvfr1 = 0x00000000;
    cpu->ctr = 0x1dd20d2;
    cpu->reset_sctlr = 0x00050078;
    cpu->id_pfr0 = 0x111;
    cpu->id_pfr1 = 0x1;
    cpu->isar.id_dfr0 = 0x2;
    cpu->id_afr0 = 0x3;
    cpu->isar.id_mmfr0 = 0x01130003;
    cpu->isar.id_mmfr1 = 0x10030302;
    cpu->isar.id_mmfr2 = 0x01222110;
    cpu->isar.id_isar0 = 0x00140011;
    cpu->isar.id_isar1 = 0x12002111;
    cpu->isar.id_isar2 = 0x11231111;
    cpu->isar.id_isar3 = 0x01102131;
    cpu->isar.id_isar4 = 0x141;
    cpu->reset_auxcr = 7;
}